

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.h
# Opt level: O1

void pzgeom::TPZGeoTriangle::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  TPZFNMatrix<3,_double> phi;
  TPZFNMatrix<6,_double> dphi;
  TPZFMatrix<double> local_1a8;
  double local_118 [4];
  TPZFMatrix<double> local_f8;
  double adStack_68 [7];
  
  local_1a8.fElem = local_118;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0186ce28;
  local_1a8.fSize = 3;
  local_1a8.fGiven = local_1a8.fElem;
  TPZVec<int>::TPZVec(&local_1a8.fPivot.super_TPZVec<int>,0);
  local_1a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1a8.fPivot.super_TPZVec<int>.fStore = local_1a8.fPivot.fExtAlloc;
  local_1a8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1a8.fWork.fStore = (double *)0x0;
  local_1a8.fWork.fNElements = 0;
  local_1a8.fWork.fNAlloc = 0;
  local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0186cb38;
  local_f8.fElem = adStack_68;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 2;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018ab3b0;
  local_f8.fSize = 6;
  local_f8.fGiven = local_f8.fElem;
  TPZVec<int>::TPZVec(&local_f8.fPivot.super_TPZVec<int>,0);
  local_f8.fPivot.super_TPZVec<int>.fStore = local_f8.fPivot.fExtAlloc;
  local_f8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_f8.fPivot.super_TPZVec<int>.fNElements = 0;
  local_f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_f8.fWork.fStore = (double *)0x0;
  local_f8.fWork.fNElements = 0;
  local_f8.fWork.fNAlloc = 0;
  local_f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018ab0c0;
  pztopology::TPZTriangle::TShape<double>(loc,&local_1a8,&local_f8);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      x->fStore[uVar4] = 0.0;
      lVar3 = 0;
      do {
        if ((local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_1a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_1a8.fElem[lVar3];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar4,lVar3);
        x->fStore[uVar4] = dVar1 * extraout_XMM0_Qa + x->fStore[uVar4];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_f8,&PTR_PTR_018ab378);
  TPZFMatrix<double>::~TPZFMatrix(&local_1a8,&PTR_PTR_0186cdf0);
  return;
}

Assistant:

static void X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x) {

            TPZFNMatrix<3,T> phi(3,1);
            TPZFNMatrix<6,T> dphi(2,3);
            TShape(loc,phi,dphi);
            int space = nodes.Rows();

            for(int i = 0; i < space; i++) {
                x[i] = 0.0;
                for(int j = 0; j < 3; j++) {
                    x[i] += phi(j,0)*nodes.GetVal(i,j);
                }
            }
        }